

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O3

bool __thiscall
soul::SourceCodeOperations::reparse
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code)

{
  SourceCodeText *pSVar1;
  SourceCodeText *o;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  Namespace *parentNamespace;
  pointer pCVar5;
  pool_ref<soul::AST::ModuleBase> *m;
  pointer ppVar6;
  long in_FS_OFFSET;
  bool bVar7;
  CompileMessageHandler handler;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_78;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  undefined8 local_40;
  CodeLocation local_38;
  
  clear(this);
  pSVar1 = (code->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  o = (this->source).sourceCode.object;
  (this->source).sourceCode.object = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  (this->source).location.data = (code->location).data;
  local_48 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_invoke;
  local_60._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(const_soul::CompileMessageGroup_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_CompileMessageList.cpp:200:30)>
             ::_M_manager;
  local_40 = *(undefined8 *)(in_FS_OFFSET + -8);
  *(_Any_data **)(in_FS_OFFSET + -8) = &local_60;
  local_60._M_unused._M_object = messageList;
  parentNamespace = AST::createRootNamespace(&this->allocator);
  (this->topLevelNamespace).object = parentNamespace;
  pSVar1 = (code->sourceCode).object;
  (code->sourceCode).object = (SourceCodeText *)0x0;
  local_38.location.data = (code->location).data;
  local_38.sourceCode.object = pSVar1;
  Compiler::parseTopLevelDeclarations(&local_78,&this->allocator,&local_38,parentNamespace);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar1);
  for (ppVar6 = local_78.
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 != local_78.
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
    recurseFindingModules(this,ppVar6->object);
  }
  if (local_78.
      super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  CompileMessageHandler::~CompileMessageHandler((CompileMessageHandler *)&local_60);
  pCVar2 = (messageList->messages).
           super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (messageList->messages).
           super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar2 == pCVar3) {
    bVar4 = true;
  }
  else {
    do {
      pCVar5 = pCVar2 + 1;
      bVar7 = (pCVar2->type & ~internalCompilerError) == error;
      bVar4 = !bVar7;
      if (bVar7) {
        return bVar4;
      }
      pCVar2 = pCVar5;
    } while (pCVar5 != pCVar3);
  }
  return bVar4;
}

Assistant:

bool SourceCodeOperations::reparse (CompileMessageList& messageList, CodeLocation code)
{
    clear();
    source = code;

    try
    {
        CompileMessageHandler handler (messageList);
        topLevelNamespace = AST::createRootNamespace (allocator);

        for (auto& m : Compiler::parseTopLevelDeclarations (allocator, std::move (code), *topLevelNamespace))
            recurseFindingModules (m);
    }
    catch (AbortCompilationException)
    {
        clear();
    }

    return ! messageList.hasErrors();
}